

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void __thiscall image_u8::image_u8(image_u8 *this,uint32_t width,uint32_t height)

{
  undefined4 in_EDX;
  undefined4 in_ESI;
  size_type in_RDI;
  vector<color_quad_u8,_std::allocator<color_quad_u8>_> *unaff_retaddr;
  size_type __new_size;
  
  __new_size = in_RDI;
  std::vector<color_quad_u8,_std::allocator<color_quad_u8>_>::vector
            ((vector<color_quad_u8,_std::allocator<color_quad_u8>_> *)0x13beef);
  *(undefined4 *)(in_RDI + 0x18) = in_ESI;
  *(undefined4 *)(in_RDI + 0x1c) = in_EDX;
  std::vector<color_quad_u8,_std::allocator<color_quad_u8>_>::resize(unaff_retaddr,__new_size);
  return;
}

Assistant:

image_u8(uint32_t width, uint32_t height) :
		m_width(width), m_height(height)
	{
		m_pixels.resize(width * height);
	}